

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

void __thiscall
vkt::sr::QuadGrid::QuadGrid
          (QuadGrid *this,int gridSize,int width,int height,Vec4 *constCoords,
          vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
          *userAttribTransforms,
          vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
          *textures)

{
  short sVar1;
  short sVar2;
  short sVar3;
  float fVar4;
  value_type vVar5;
  value_type vVar6;
  int iVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *local_f8;
  int baseNdx;
  int v11;
  int v10;
  int v01;
  int v00;
  int stride;
  int x_1;
  int y_1;
  int local_c8;
  float fStack_c4;
  float local_c0;
  int attribNdx;
  tcu local_ac [16];
  undefined1 local_9c [32];
  pointer local_7c;
  pointer pMStack_74;
  int local_6c;
  float local_68;
  int vtxNdx;
  float fy;
  float fx;
  float sy;
  float sx;
  int x;
  int y;
  int attrNdx;
  undefined1 local_40 [8];
  Vec4 viewportScale;
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
  *userAttribTransforms_local;
  Vec4 *constCoords_local;
  int height_local;
  int width_local;
  int gridSize_local;
  QuadGrid *this_local;
  
  this->m_gridSize = gridSize;
  this->m_numVertices = (gridSize + 1) * (gridSize + 1);
  this->m_numTriangles = gridSize * gridSize * 2;
  viewportScale.m_data._8_8_ = userAttribTransforms;
  tcu::Vector<float,_4>::Vector(&this->m_constCoords,constCoords);
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::vector
            (&this->m_userAttribTransforms,
             (vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *)
             viewportScale.m_data._8_8_);
  this->m_textures = textures;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&this->m_screenPos);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&this->m_positions);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&this->m_coords);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&this->m_unitCoords);
  std::vector<float,_std::allocator<float>_>::vector(&this->m_attribOne);
  local_f8 = this->m_userAttribs;
  do {
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector(local_f8);
    local_f8 = local_f8 + 1;
  } while (local_f8 !=
           (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
           &this->m_indices);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->m_indices);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_40,(float)width,(float)height,0.0,0.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this->m_screenPos,(long)this->m_numVertices);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this->m_positions,(long)this->m_numVertices);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this->m_coords,(long)this->m_numVertices);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this->m_unitCoords,(long)this->m_numVertices);
  std::vector<float,_std::allocator<float>_>::resize(&this->m_attribOne,(long)this->m_numVertices);
  for (x = 0; x < 4; x = x + 1) {
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              (this->m_userAttribs + x,(long)this->m_numVertices);
  }
  for (sx = 0.0; (int)sx < gridSize + 1; sx = (float)((int)sx + 1)) {
    for (sy = 0.0; (int)sy < gridSize + 1; sy = (float)((int)sy + 1)) {
      fx = (float)(int)sy / (float)gridSize;
      fy = (float)(int)sx / (float)gridSize;
      vtxNdx = (int)(fx + fx + -1.0);
      local_68 = fy + fy + -1.0;
      local_6c = (int)sx * (gridSize + 1) + (int)sy;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_7c,(float)vtxNdx,local_68,0.0,1.0);
      pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](&this->m_positions,(long)local_6c);
      *(pointer *)pvVar8->m_data = local_7c;
      *(pointer *)(pvVar8->m_data + 2) = pMStack_74;
      getCoords((QuadGrid *)(local_9c + 0x10),fx,fy);
      pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](&this->m_coords,(long)local_6c);
      *(undefined8 *)pvVar8->m_data = local_9c._16_8_;
      *(undefined8 *)(pvVar8->m_data + 2) = local_9c._24_8_;
      getUnitCoords((QuadGrid *)local_9c,fx,fy);
      pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](&this->m_unitCoords,(long)local_6c);
      *(undefined8 *)pvVar8->m_data = local_9c._0_8_;
      *(undefined8 *)(pvVar8->m_data + 2) = local_9c._8_8_;
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&this->m_attribOne,(long)local_6c);
      *pvVar9 = 1.0;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xffffffffffffff44,fx,fy,0.0,1.0);
      tcu::operator*(local_ac,(Vector<float,_4> *)&stack0xffffffffffffff44,
                     (Vector<float,_4> *)local_40);
      pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](&this->m_screenPos,(long)local_6c);
      *(undefined8 *)pvVar8->m_data = local_ac._0_8_;
      *(undefined8 *)(pvVar8->m_data + 2) = local_ac._8_8_;
      local_c0 = 0.0;
      while( true ) {
        fVar4 = local_c0;
        iVar7 = getNumUserAttribs(this);
        if (iVar7 <= (int)fVar4) break;
        getUserAttrib((QuadGrid *)&x_1,(int)this,fx,fy);
        pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](this->m_userAttribs + (int)local_c0,(long)local_6c);
        pvVar8->m_data[0] = (float)x_1;
        pvVar8->m_data[1] = (float)y_1;
        pvVar8->m_data[2] = (float)local_c8;
        pvVar8->m_data[3] = fStack_c4;
        local_c0 = (float)((int)local_c0 + 1);
      }
    }
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&this->m_indices,(long)(this->m_numTriangles * 3));
  for (stride = 0; stride < gridSize; stride = stride + 1) {
    for (v00 = 0; v00 < gridSize; v00 = v00 + 1) {
      sVar3 = (short)gridSize + 1;
      sVar2 = (short)stride;
      sVar1 = (short)v00;
      vVar5 = sVar2 * sVar3 + sVar1 + 1;
      vVar6 = (sVar2 + 1) * sVar3 + sVar1;
      iVar7 = (stride * gridSize + v00) * 6;
      pvVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          (&this->m_indices,(long)iVar7);
      *pvVar10 = vVar6;
      pvVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          (&this->m_indices,(long)(iVar7 + 1));
      *pvVar10 = sVar2 * sVar3 + sVar1;
      pvVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          (&this->m_indices,(long)(iVar7 + 2));
      *pvVar10 = vVar5;
      pvVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          (&this->m_indices,(long)(iVar7 + 3));
      *pvVar10 = vVar6;
      pvVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          (&this->m_indices,(long)(iVar7 + 4));
      *pvVar10 = vVar5;
      pvVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          (&this->m_indices,(long)(iVar7 + 5));
      *pvVar10 = (sVar2 + 1) * sVar3 + sVar1 + 1;
    }
  }
  return;
}

Assistant:

QuadGrid::QuadGrid (int										gridSize,
					int										width,
					int										height,
					const tcu::Vec4&						constCoords,
					const std::vector<tcu::Mat4>&			userAttribTransforms,
					const std::vector<TextureBindingSp>&	textures)
	: m_gridSize				(gridSize)
	, m_numVertices				((gridSize + 1) * (gridSize + 1))
	, m_numTriangles			(gridSize * gridSize * 2)
	, m_constCoords				(constCoords)
	, m_userAttribTransforms	(userAttribTransforms)
	, m_textures				(textures)
{
	const tcu::Vec4 viewportScale	((float)width, (float)height, 0.0f, 0.0f);

	// Compute vertices.
	m_screenPos.resize(m_numVertices);
	m_positions.resize(m_numVertices);
	m_coords.resize(m_numVertices);
	m_unitCoords.resize(m_numVertices);
	m_attribOne.resize(m_numVertices);

	// User attributes.
	for (int attrNdx = 0; attrNdx < DE_LENGTH_OF_ARRAY(m_userAttribs); attrNdx++)
		m_userAttribs[attrNdx].resize(m_numVertices);

	for (int y = 0; y < gridSize+1; y++)
	for (int x = 0; x < gridSize+1; x++)
	{
		float		sx			= (float)x / (float)gridSize;
		float		sy			= (float)y / (float)gridSize;
		float		fx			= 2.0f * sx - 1.0f;
		float		fy			= 2.0f * sy - 1.0f;
		int			vtxNdx		= ((y * (gridSize+1)) + x);

		m_positions[vtxNdx]		= tcu::Vec4(fx, fy, 0.0f, 1.0f);
		m_coords[vtxNdx]		= getCoords(sx, sy);
		m_unitCoords[vtxNdx]	= getUnitCoords(sx, sy);
		m_attribOne[vtxNdx]		= 1.0f;

		m_screenPos[vtxNdx]		= tcu::Vec4(sx, sy, 0.0f, 1.0f) * viewportScale;

		for (int attribNdx = 0; attribNdx < getNumUserAttribs(); attribNdx++)
			m_userAttribs[attribNdx][vtxNdx] = getUserAttrib(attribNdx, sx, sy);
	}

	// Compute indices.
	m_indices.resize(3 * m_numTriangles);
	for (int y = 0; y < gridSize; y++)
	for (int x = 0; x < gridSize; x++)
	{
		int stride				= gridSize + 1;
		int v00					= (y * stride) + x;
		int v01					= (y * stride) + x + 1;
		int v10					= ((y+1) * stride) + x;
		int v11					= ((y+1) * stride) + x + 1;

		int baseNdx				= ((y * gridSize) + x) * 6;
		m_indices[baseNdx + 0]	= (deUint16)v10;
		m_indices[baseNdx + 1]	= (deUint16)v00;
		m_indices[baseNdx + 2]	= (deUint16)v01;

		m_indices[baseNdx + 3]	= (deUint16)v10;
		m_indices[baseNdx + 4]	= (deUint16)v01;
		m_indices[baseNdx + 5]	= (deUint16)v11;
	}
}